

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fTextureMipmapTests.cpp
# Opt level: O3

int __thiscall
deqp::gles2::Functional::TextureCubeGenMipmapCase::init
          (TextureCubeGenMipmapCase *this,EVP_PKEY_CTX *ctx)

{
  int iVar1;
  int iVar2;
  int extraout_EAX;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  TextureCube *this_00;
  NotSupportedError *this_01;
  long *plVar3;
  size_type *psVar4;
  int local_f0;
  int local_ec;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e8;
  string local_c8;
  string local_a8;
  string local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  
  iVar1 = (*this->m_renderCtx->_vptr_RenderContext[4])();
  if (SBORROW4(*(int *)CONCAT44(extraout_var,iVar1),this->m_size * 3) ==
      *(int *)CONCAT44(extraout_var,iVar1) + this->m_size * -3 < 0) {
    iVar2 = (*this->m_renderCtx->_vptr_RenderContext[4])();
    iVar1 = this->m_size;
    if (iVar1 * 2 <= *(int *)(CONCAT44(extraout_var_00,iVar2) + 4)) {
      this_00 = (TextureCube *)operator_new(0x180);
      glu::TextureCube::TextureCube(this_00,this->m_renderCtx,this->m_format,this->m_dataType,iVar1)
      ;
      this->m_texture = this_00;
      return extraout_EAX;
    }
  }
  this_01 = (NotSupportedError *)__cxa_allocate_exception(0x38);
  local_ec = this->m_size * 3;
  de::toString<int>(&local_c8,&local_ec);
  std::operator+(&local_68,"Render target size must be at least (",&local_c8);
  plVar3 = (long *)std::__cxx11::string::append((char *)&local_68);
  local_e8._M_dataplus._M_p = (pointer)*plVar3;
  psVar4 = (size_type *)(plVar3 + 2);
  if ((size_type *)local_e8._M_dataplus._M_p == psVar4) {
    local_e8.field_2._M_allocated_capacity = *psVar4;
    local_e8.field_2._8_8_ = plVar3[3];
    local_e8._M_dataplus._M_p = (pointer)&local_e8.field_2;
  }
  else {
    local_e8.field_2._M_allocated_capacity = *psVar4;
  }
  local_e8._M_string_length = plVar3[1];
  *plVar3 = (long)psVar4;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  local_f0 = this->m_size * 2;
  de::toString<int>(&local_88,&local_f0);
  std::operator+(&local_48,&local_e8,&local_88);
  plVar3 = (long *)std::__cxx11::string::append((char *)&local_48);
  local_a8._M_dataplus._M_p = (pointer)*plVar3;
  psVar4 = (size_type *)(plVar3 + 2);
  if ((size_type *)local_a8._M_dataplus._M_p == psVar4) {
    local_a8.field_2._M_allocated_capacity = *psVar4;
    local_a8.field_2._8_8_ = plVar3[3];
    local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
  }
  else {
    local_a8.field_2._M_allocated_capacity = *psVar4;
  }
  local_a8._M_string_length = plVar3[1];
  *plVar3 = (long)psVar4;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  tcu::NotSupportedError::NotSupportedError(this_01,&local_a8);
  __cxa_throw(this_01,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

void TextureCubeGenMipmapCase::init (void)
{
	if (m_renderCtx.getRenderTarget().getWidth() < 3*m_size || m_renderCtx.getRenderTarget().getHeight() < 2*m_size)
		throw tcu::NotSupportedError("Render target size must be at least (" + de::toString(3*m_size) + ", " + de::toString(2*m_size) + ")");

	DE_ASSERT(!m_texture);
	m_texture = new TextureCube(m_renderCtx, m_format, m_dataType, m_size);
}